

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O1

bool __thiscall
SharedMemRingBuffer::InitIndexBuffer(SharedMemRingBuffer *this,key_t key_index_buffer,size_t size)

{
  StatusOnSharedMem *pSVar1;
  _func_int **pp_Var2;
  bool bVar3;
  ulong in_RAX;
  _PositionInfo_ *p_Var4;
  WaitStrategyInterface *pWVar5;
  size_t sVar6;
  ulong uVar7;
  bool bSharedMemFirstCreated;
  undefined8 uStack_28;
  
  if (size == 0) {
    return false;
  }
  this->buffer_size_ = size;
  uStack_28 = in_RAX;
  bVar3 = RingBuffer<_PositionInfo__*>::SetCapacity(&this->ring_buffer_,size);
  if (bVar3) {
    sVar6 = size * 0x20 + 0x780;
    this->total_mem_size_ = sVar6;
    uStack_28 = uStack_28 & 0xffffffffffffff;
    bVar3 = SharedMemoryManager::CreateShMem
                      (&this->shared_index_buffer_,key_index_buffer,sVar6,
                       (bool *)((long)&uStack_28 + 7));
    if ((bVar3) && (bVar3 = SharedMemoryManager::AttachShMem(&this->shared_index_buffer_), bVar3)) {
      this->ring_buffer_status_on_shared_mem_ =
           (StatusOnSharedMem *)(this->shared_index_buffer_).sh_mem_start_addr_;
      if (uStack_28._7_1_ == '\x01') {
        ResetRingBufferState(this);
      }
      p_Var4 = (_PositionInfo_ *)((long)(this->shared_index_buffer_).sh_mem_start_addr_ + 0x780);
      sVar6 = (this->ring_buffer_).capacity_;
      uVar7 = 0;
      do {
        (this->ring_buffer_).buffer_.
        super__Vector_base<_PositionInfo__*,_std::allocator<_PositionInfo__*>_>._M_impl.
        super__Vector_impl_data._M_start[sVar6 - 1 & uVar7] = p_Var4;
        uVar7 = uVar7 + 1;
        p_Var4 = p_Var4 + 1;
      } while (size + (size == 0) != uVar7);
      pSVar1 = this->ring_buffer_status_on_shared_mem_;
      pSVar1->nBufferSize = (int)size;
      pSVar1->nTotalMemSize = (int)this->total_mem_size_;
      if ((ulong)this->wait_strategy_type_ < 3) {
        pp_Var2 = (_func_int **)(&PTR_PTR_00106d98)[this->wait_strategy_type_];
        pWVar5 = (WaitStrategyInterface *)operator_new(0x10);
        pWVar5->_vptr_WaitStrategyInterface = pp_Var2;
        pWVar5->status_on_shared_mem_ = pSVar1;
        this->wait_strategy_ = pWVar5;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool SharedMemRingBuffer::InitIndexBuffer(key_t key_index_buffer, size_t size )
{
    if(size == 0) {
        DEBUG_ELOG("Error: Invalid size : " << size); 
        return false;
    }
    buffer_size_ = size;

    if(!ring_buffer_.SetCapacity(size) ) {
        DEBUG_ELOG("Error: Invalid size : " << size); 
        return false;
    }
    //shared memory consists of : StatusOnSharedMem + actual data
    total_mem_size_ = sizeof(_StatusOnSharedMem_)  + (sizeof(PositionInfo) * size) ;

    bool bSharedMemFirstCreated = false;
    if(! shared_index_buffer_.CreateShMem(key_index_buffer, total_mem_size_, &bSharedMemFirstCreated )) {
        DEBUG_ELOG("Error: shared memory failed "); 
        return false;
    }
    if(! shared_index_buffer_.AttachShMem()) {
        DEBUG_ELOG("Error: shared memory failed "); 
        return false;
    }

    ring_buffer_status_on_shared_mem_ = (StatusOnSharedMem*) shared_index_buffer_. GetShMemStartAddr(); 
    if(bSharedMemFirstCreated) {
        ResetRingBufferState();
    }
    char* buffer_start = (char*)shared_index_buffer_.GetShMemStartAddr() + sizeof(_StatusOnSharedMem_) ; 

    for(size_t i = 0; i < size; i++) {
        ring_buffer_[i] = (PositionInfo*) ( (char*)buffer_start + (sizeof(PositionInfo)*i) ) ;
    }

    ring_buffer_status_on_shared_mem_->nBufferSize = size;
    ring_buffer_status_on_shared_mem_->nTotalMemSize = total_mem_size_;

    //---------------------------------------------
    //wait strategy
    if(wait_strategy_type_ == BLOCKING_WAIT ) {
        DEBUG_LOG ("Wait Strategy :BLOCKING_WAIT" ); 
        wait_strategy_ = new BlockingWaitStrategy(ring_buffer_status_on_shared_mem_);
    } else if(wait_strategy_type_ == YIELDING_WAIT ) {
        DEBUG_LOG( "Wait Strategy :YIELDING_WAIT" ); 
        wait_strategy_ = new YieldingWaitStrategy(ring_buffer_status_on_shared_mem_);
    } else if(wait_strategy_type_ == SLEEPING_WAIT ) {
        DEBUG_LOG( "Wait Strategy :SLEEPING_WAIT" ); 
        wait_strategy_ = new SleepingWaitStrategy(ring_buffer_status_on_shared_mem_);
    } else {
        DEBUG_ELOG( "Invalid Wait Strategy :" << wait_strategy_type_); 
        return false;
    }
    return true;
}